

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pool.h
# Opt level: O0

void __thiscall ChunkedStackPool<65532>::~ChunkedStackPool(ChunkedStackPool<65532> *this)

{
  ChunkedStackPool<65532> *this_local;
  
  Reset(this);
  return;
}

Assistant:

~ChunkedStackPool()
	{
		Reset();
	}